

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

FieldSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::addMemberSchema
          (FieldSourceInfoBuilderPair *__return_storage_ptr__,MemberInfo *this)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  PointerType PVar3;
  WirePointer *pWVar4;
  Fault f;
  ListBuilder local_90;
  ListBuilder local_68;
  PointerBuilder local_40;
  
  if (this->childInitializedCount < this->childCount) {
    pSVar1 = (this->node)._builder.segment;
    pCVar2 = (this->node)._builder.capTable;
    pWVar4 = (this->node)._builder.pointers + 3;
    local_68.segment = pSVar1;
    local_68.capTable = pCVar2;
    local_68.ptr = (byte *)pWVar4;
    PVar3 = _::PointerBuilder::getPointerType((PointerBuilder *)&local_68);
    local_90.segment = pSVar1;
    local_90.capTable = pCVar2;
    local_90.ptr = (byte *)pWVar4;
    if (PVar3 == NULL_) {
      if (this->parent != (MemberInfo *)0x0) {
        getSchema((Builder *)&local_68,this);
      }
      _::PointerBuilder::initStructList
                (&local_68,(PointerBuilder *)&local_90,this->childCount,(StructSize)0x40003);
      _::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_68,this->childInitializedCount);
      local_40.segment = (this->sourceInfo)._builder.segment;
      local_40.capTable = (this->sourceInfo)._builder.capTable;
      local_40.pointer = (this->sourceInfo)._builder.pointers + 1;
      _::PointerBuilder::initStructList(&local_90,&local_40,this->childCount,(StructSize)0x10000);
    }
    else {
      _::PointerBuilder::getStructList
                (&local_68,(PointerBuilder *)&local_90,(StructSize)0x40003,(word *)0x0);
      _::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_68,this->childInitializedCount);
      local_40.segment = (this->sourceInfo)._builder.segment;
      local_40.capTable = (this->sourceInfo)._builder.capTable;
      local_40.pointer = (this->sourceInfo)._builder.pointers + 1;
      _::PointerBuilder::getStructList(&local_90,&local_40,(StructSize)0x10000,(word *)0x0);
    }
    _::ListBuilder::getStructElement
              (&(__return_storage_ptr__->sourceInfo)._builder,&local_90,this->childInitializedCount)
    ;
    this->childInitializedCount = this->childInitializedCount + 1;
    return __return_storage_ptr__;
  }
  local_90.segment = (SegmentBuilder *)0x0;
  local_68.segment = (SegmentBuilder *)0x0;
  local_68.capTable = (CapTableBuilder *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_90,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_90);
}

Assistant:

addMemberSchema() {
      // Get the schema builder for the child member at the given index.  This lazily/dynamically
      // builds the builder tree.

      KJ_REQUIRE(childInitializedCount < childCount);

      auto structNode = node.getStruct();
      if (!structNode.hasFields()) {
        if (parent != nullptr) {
          getSchema();  // Make sure field exists in parent once the first child is added.
        }
        FieldSourceInfoBuilderPair result {
          structNode.initFields(childCount)[childInitializedCount],
          sourceInfo.initMembers(childCount)[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      } else {
        FieldSourceInfoBuilderPair result {
          structNode.getFields()[childInitializedCount],
          sourceInfo.getMembers()[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      }
    }